

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QStyleOptionViewItem::ViewItemPosition>::copyAppend
          (QPodArrayOps<QStyleOptionViewItem::ViewItemPosition> *this,ViewItemPosition *b,
          ViewItemPosition *e)

{
  ViewItemPosition *__dest;
  void *in_RDX;
  void *in_RSI;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_RDI;
  
  if (in_RSI != in_RDX) {
    __dest = QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::end(in_RDI);
    memcpy(__dest,in_RSI,((long)in_RDX - (long)in_RSI >> 2) << 2);
    in_RDI->size = ((long)in_RDX - (long)in_RSI >> 2) + in_RDI->size;
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }